

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_gen_impl.h
# Opt level: O0

void secp256k1_ecmult_gen_context_finalize_memcpy
               (secp256k1_ecmult_gen_context *dst,secp256k1_ecmult_gen_context *src)

{
  secp256k1_ecmult_gen_context *src_local;
  secp256k1_ecmult_gen_context *dst_local;
  
  return;
}

Assistant:

static void secp256k1_ecmult_gen_context_finalize_memcpy(secp256k1_ecmult_gen_context *dst, const secp256k1_ecmult_gen_context *src) {
#ifndef USE_ECMULT_STATIC_PRECOMPUTATION
    if (src->prec != NULL) {
        /* We cast to void* first to suppress a -Wcast-align warning. */
        dst->prec = (secp256k1_ge_storage (*)[ECMULT_GEN_PREC_N][ECMULT_GEN_PREC_G])(void*)((unsigned char*)dst + ((unsigned char*)src->prec - (unsigned char*)src));
    }
#else
    (void)dst, (void)src;
#endif
}